

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.h
# Opt level: O0

void __thiscall upb::generator::Plugin::Plugin(Plugin *this)

{
  Plugin *this_local;
  
  Arena::Arena(&this->arena_);
  DefPool::DefPool(&this->pool_);
  ReadRequest(this);
  return;
}

Assistant:

Plugin() { ReadRequest(); }